

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O1

void clean_loaded_buffer(void)

{
  munmap(buf,0x160);
  close(shmfd);
  sem_close((sem_t *)free_sem);
  sem_close((sem_t *)used_sem);
  sem_close((sem_t *)write_sem);
  fwrite("cleanup\n",8,1,_stdout);
  return;
}

Assistant:

void clean_loaded_buffer()
{
    munmap(buf, sizeof(*buf));
    close(shmfd);
    sem_close(free_sem);
    sem_close(used_sem);
    sem_close(write_sem);
    fprintf(stdout, "cleanup\n");
}